

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

void __thiscall CVmObjByteArray::load_image_data(CVmObjByteArray *this,char *ptr,size_t siz)

{
  unsigned_long uVar1;
  CVmObjByteArray *this_00;
  undefined1 *in_RDX;
  void *in_RSI;
  long *in_RDI;
  unsigned_long unaff_retaddr;
  size_t avail;
  size_t chunk_size;
  uchar *dstp;
  unsigned_long idx;
  unsigned_long cnt;
  undefined1 *local_40;
  undefined1 *local_38;
  size_t *in_stack_ffffffffffffffd0;
  undefined1 *idx_00;
  undefined1 *local_18;
  undefined1 *local_10;
  
  (**(code **)(*in_RDI + 0x10))(in_RDI,0);
  uVar1 = ::osrp4(in_RSI);
  this_00 = (CVmObjByteArray *)(uVar1 & 0xffffffff);
  local_18 = in_RDX;
  if ((undefined1 *)((long)&(this_00->super_CVmObject)._vptr_CVmObject + 4U) < in_RDX) {
    local_18 = (undefined1 *)((long)&(this_00->super_CVmObject)._vptr_CVmObject + 4);
  }
  alloc_array((CVmObjByteArray *)chunk_size,CONCAT17(avail._7_1_,(undefined7)avail));
  if (local_18 < (undefined1 *)((long)this_00 * 5 + 2U)) {
    fill_with((CVmObjByteArray *)chunk_size,avail._7_1_,unaff_retaddr,(unsigned_long)in_RDI);
  }
  local_10 = (undefined1 *)((long)in_RSI + 4);
  idx_00 = (undefined1 *)0x1;
  for (local_18 = local_18 + -4; local_18 != (undefined1 *)0x0;
      local_18 = local_18 + -(long)local_38) {
    in_stack_ffffffffffffffd0 =
         (size_t *)get_ele_ptr(this_00,(unsigned_long)idx_00,in_stack_ffffffffffffffd0);
    local_38 = local_40;
    if (local_18 < local_40) {
      local_38 = local_18;
    }
    memcpy(in_stack_ffffffffffffffd0,local_10,(size_t)local_38);
    idx_00 = local_38 + (long)idx_00;
    local_10 = local_38 + (long)local_10;
  }
  return;
}

Assistant:

void CVmObjByteArray::load_image_data(VMG_ const char *ptr, size_t siz)
{
    unsigned long cnt;
    unsigned long idx;

    /* if we already have memory allocated, free it */
    notify_delete(vmg_ FALSE);

    /* get the new array size */
    cnt = t3rp4u(ptr);

    /* make sure the size isn't larger than we'd expect */
    if (siz > 4 + cnt)
        siz = 4 + cnt;

    /* allocate memory at the new size as indicated in the image data */
    alloc_array(vmg_ cnt);

    /* if the size is smaller than we'd expect, set extra elements to nil */
    if (siz < VMB_LEN + (VMB_DATAHOLDER * cnt))
    {
        /* fill everything with zeros to start with */
        fill_with(0, 1, cnt);
    }

    /* copy the bytes */
    for (ptr += 4, siz -= 4, idx = 1 ; siz != 0 ; )
    {
        unsigned char *dstp;
        size_t chunk_size;
        size_t avail;

        /* get the next chunk */
        dstp = get_ele_ptr(idx, &avail);

        /* limit this chunk size to the remaining copy size */
        chunk_size = avail;
        if (chunk_size > siz)
            chunk_size = siz;

        /* copy this chunk */
        memcpy(dstp, ptr, chunk_size);

        /* advance past this chunk */
        idx += chunk_size;
        ptr += chunk_size;
        siz -= chunk_size;
    }
}